

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void createBasicTextures(void)

{
  undefined2 local_e;
  undefined1 local_c;
  undefined2 local_b;
  undefined1 local_9;
  u8 blue [3];
  u8 white [3];
  
  (*glad_debug_glGenSamplers)(1,&gpu::basicSampler);
  (*glad_debug_glSamplerParameteri)(gpu::basicSampler,0x2801,0x2600);
  (*glad_debug_glSamplerParameteri)(gpu::basicSampler,0x2800,0x2600);
  (*glad_debug_glGenTextures)(2,&gpu::whiteTexture);
  local_b = 0xffff;
  local_9 = 0xff;
  (*glad_debug_glBindTexture)(0xde1,gpu::whiteTexture);
  (*glad_debug_glTexImage2D)(0xde1,0,0x1907,1,1,0,0x1907,0x1401,&local_b);
  local_e = 0;
  local_c = 0xff;
  (*glad_debug_glBindTexture)(0xde1,gpu::blueTexture);
  (*glad_debug_glTexImage2D)(0xde1,0,0x1907,1,1,0,0x1907,0x1401,&local_e);
  return;
}

Assistant:

void createBasicTextures()
{
    glGenSamplers(1, &gpu::basicSampler);
    glSamplerParameteri(gpu::basicSampler, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glSamplerParameteri(gpu::basicSampler, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

    glGenTextures(2, &gpu::whiteTexture);

    const u8 white[3] = {255, 255, 255};
    glBindTexture(GL_TEXTURE_2D, gpu::whiteTexture);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, white);

    const u8 blue[3] = {0, 0, 255};
    glBindTexture(GL_TEXTURE_2D, gpu::blueTexture);
    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 1, 1, 0, GL_RGB, GL_UNSIGNED_BYTE, blue);
}